

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::IsObjTypeSpecEquivalent
          (DictionaryTypeHandlerBase<int> *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  EquivalentPropertyEntry *entry;
  bool bVar4;
  
  uVar2 = (ulong)record->propertyCount;
  bVar4 = uVar2 == 0;
  if (!bVar4) {
    entry = record->properties;
    bVar1 = IsObjTypeSpecEquivalentImpl<false>(this,type,entry);
    uVar3 = 0;
    if (bVar1) {
      uVar3 = 0;
      do {
        entry = entry + 1;
        if (uVar2 - 1 == uVar3) {
          return uVar2 <= uVar3 + 1;
        }
        bVar4 = IsObjTypeSpecEquivalentImpl<false>(this,type,entry);
        uVar3 = uVar3 + 1;
      } while (bVar4);
      bVar4 = uVar2 <= uVar3;
    }
    *failedPropertyIndex = (uint)uVar3;
  }
  return bVar4;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        uint propertyCount = record.propertyCount;
        EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->IsObjTypeSpecEquivalentImpl<false>(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }